

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int check_mapping(saucy *s,int *adj,int *edg,int k)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  
  lVar2 = (long)k;
  iVar1 = adj[lVar2];
  if (iVar1 != adj[lVar2 + 1]) {
    piVar3 = edg + iVar1;
    do {
      s->stuff[s->gamma[*piVar3]] = '\x01';
      piVar3 = piVar3 + 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != adj[lVar2 + 1]);
  }
  iVar1 = 1;
  if (adj[s->gamma[lVar2]] != adj[(long)s->gamma[lVar2] + 1]) {
    lVar5 = (long)adj[s->gamma[lVar2]];
    do {
      iVar1 = (int)s->stuff[edg[lVar5]];
      if (s->stuff[edg[lVar5]] == '\0') break;
      bVar6 = (long)adj[(long)s->gamma[lVar2] + 1] + -1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar6);
  }
  iVar4 = adj[lVar2];
  if (iVar4 != adj[lVar2 + 1]) {
    piVar3 = edg + iVar4;
    do {
      s->stuff[s->gamma[*piVar3]] = '\0';
      piVar3 = piVar3 + 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 != adj[lVar2 + 1]);
  }
  return iVar1;
}

Assistant:

static int
check_mapping(struct saucy *s, const int *adj, const int *edg, int k)
{
    int i, gk, ret = 1;

    /* Mark gamma of neighbors */
    for (i = adj[k]; i != adj[k+1]; ++i) {
        s->stuff[s->gamma[edg[i]]] = 1;
    }

    /* Check neighbors of gamma */
    gk = s->gamma[k];
    for (i = adj[gk]; ret && i != adj[gk+1]; ++i) {
        ret = s->stuff[edg[i]];
    }

    /* Clear out bit vector before we leave */
    for (i = adj[k]; i != adj[k+1]; ++i) {
        s->stuff[s->gamma[edg[i]]] = 0;
    }

    return ret;
}